

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O0

SuffixHandler<double> __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::AddSuffix<double>
          (BasicProblem<mp::BasicProblemParams<int>_> *this,StringRef name,int kind)

{
  StringRef name_00;
  BasicMutSuffix<double> s;
  size_t in_RSI;
  SuffixManager *in_RDI;
  Kind main_kind;
  Kind in_stack_ffffffffffffff5c;
  Kind in_stack_ffffffffffffff8c;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_ffffffffffffff90;
  SuffixTable *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  BasicSuffixSet<std::allocator<char>_> *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  SuffixBase local_8;
  
  SuffixManager::suffixes(in_RDI,in_stack_ffffffffffffff5c);
  GetSuffixSize(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff98);
  name_00.size_ = in_RSI;
  name_00.data_ = in_stack_ffffffffffffffb0;
  s = BasicSuffixSet<std::allocator<char>_>::Add<double>
                (in_stack_ffffffffffffffa8,name_00,in_stack_ffffffffffffffa4,
                 in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  SuffixHandler<double>::SuffixHandler((SuffixHandler<double> *)&local_8,s);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  return (BasicMutSuffix<double>)(BasicMutSuffix<double>)local_8.impl_;
}

Assistant:

SuffixHandler<T> AddSuffix(fmt::StringRef name, int kind) {
    auto main_kind = (suf::Kind)(kind & suf::KIND_MASK);
    return SuffixHandler<T>(
          suffixes(main_kind).template Add<T>(name, kind, GetSuffixSize(main_kind)));
  }